

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O1

Abc_Obj_t * Io_ReadCreateNode(Abc_Ntk_t *pNtk,char *pNameOut,char **pNamesIn,int nInputs)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar1;
  ulong uVar2;
  
  pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
  if (0 < nInputs) {
    uVar2 = 0;
    do {
      pAVar1 = Abc_NtkFindOrCreateNet(pNtk,pNamesIn[uVar2]);
      Abc_ObjAddFanin(pObj,pAVar1);
      uVar2 = uVar2 + 1;
    } while ((uint)nInputs != uVar2);
  }
  pAVar1 = Abc_NtkFindOrCreateNet(pNtk,pNameOut);
  Abc_ObjAddFanin(pAVar1,pObj);
  return pObj;
}

Assistant:

Abc_Obj_t * Io_ReadCreateNode( Abc_Ntk_t * pNtk, char * pNameOut, char * pNamesIn[], int nInputs )
{
    Abc_Obj_t * pNet, * pNode;
    int i;
    // create a new node 
    pNode = Abc_NtkCreateNode( pNtk );
    // add the fanin nets
    for ( i = 0; i < nInputs; i++ )
    {
        pNet = Abc_NtkFindOrCreateNet( pNtk, pNamesIn[i] );
        Abc_ObjAddFanin( pNode, pNet );
    }
    // add the fanout net
    pNet = Abc_NtkFindOrCreateNet( pNtk, pNameOut );
    Abc_ObjAddFanin( pNet, pNode );
    return pNode;
}